

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparser.c
# Opt level: O1

xmlParserErrors
rot13ConvImpl(void *vctxt,char *name,xmlCharEncFlags flags,xmlCharEncodingHandler **out)

{
  int iVar1;
  xmlParserErrors xVar2;
  undefined4 *puVar3;
  
  iVar1 = strcmp(name,"rot13");
  if (iVar1 != 0) {
    xVar2 = xmlCreateCharEncodingHandler(name,flags,0,0,out);
    return xVar2;
  }
  if ((flags & XML_ENC_OUTPUT) == 0) {
    puVar3 = (undefined4 *)(*_xmlMalloc)(4);
    *puVar3 = 0xd;
    xVar2 = xmlCharEncNewCustomHandler(name,rot13Convert,0,rot13ConvCtxtDtor,puVar3,0,out);
  }
  else {
    xVar2 = XML_ERR_UNSUPPORTED_ENCODING;
  }
  return xVar2;
}

Assistant:

static xmlParserErrors
rot13ConvImpl(void *vctxt ATTRIBUTE_UNUSED, const char *name,
              xmlCharEncFlags flags, xmlCharEncodingHandler **out) {
    int *inputCtxt;

    if (strcmp(name, "rot13") != 0)
        return xmlCreateCharEncodingHandler(name, flags, NULL, NULL, out);

    if (flags & XML_ENC_OUTPUT)
        return XML_ERR_UNSUPPORTED_ENCODING;

    inputCtxt = xmlMalloc(sizeof(*inputCtxt));
    *inputCtxt = 13;

    return xmlCharEncNewCustomHandler(name, rot13Convert, NULL,
                                      rot13ConvCtxtDtor, inputCtxt, NULL,
                                      out);
}